

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O1

int * Sat_Solver2GetModel(sat_solver2 *p,int *pVars,int nVars)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = (int *)calloc((long)(nVars + 1),4);
  if (0 < nVars) {
    uVar3 = 0;
    do {
      iVar1 = pVars[uVar3];
      if (((long)iVar1 < 0) || (p->size <= iVar1)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.h"
                      ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
      }
      piVar2[uVar3] = (uint)(p->model[iVar1] == 1);
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
  }
  return piVar2;
}

Assistant:

int * Sat_Solver2GetModel( sat_solver2 * p, int * pVars, int nVars )
{
    int * pModel;
    int i;
    pModel = ABC_CALLOC( int, nVars+1 );
    for ( i = 0; i < nVars; i++ )
        pModel[i] = sat_solver2_var_value(p, pVars[i]);
    return pModel;    
}